

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O2

void __thiscall
cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph
          (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *this,
          DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *depgraph,
          Span<const_unsigned_int> mapping)

{
  pointer pEVar1;
  pointer pEVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  bool local_32;
  allocator_type local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ::vector(&this->entries,
           ((long)(depgraph->entries).
                  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(depgraph->entries).
                 super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,&local_31);
  local_32 = ((long)(depgraph->entries).
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(depgraph->entries).
                   super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18 == mapping.m_size;
  inline_assertion_check<true,bool>
            (&local_32,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/cluster_linearize.h"
             ,0x7f,"DepGraph","mapping.size() == depgraph.TxCount()");
  uVar7 = 0;
  while( true ) {
    uVar6 = (ulong)uVar7;
    pEVar1 = (depgraph->entries).
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(depgraph->entries).
                       super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) / 0x18) <= uVar6)
    break;
    uVar8 = mapping.m_data[uVar6];
    pEVar2 = (this->entries).
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar2[uVar8].feerate.size = pEVar1[uVar6].feerate.size;
    pEVar2[uVar8].feerate.fee = pEVar1[uVar6].feerate.fee;
    uVar5 = pEVar1[uVar6].ancestors.m_val;
    uVar3 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    uVar6 = (ulong)uVar3;
    if (uVar5 == 0) {
      uVar6 = 0;
    }
    while (uVar5 != 0) {
      pEVar2[uVar8].ancestors.m_val =
           pEVar2[uVar8].ancestors.m_val | 1 << ((byte)mapping.m_data[uVar6] & 0x1f);
      uVar5 = uVar5 - 1 & uVar5;
      uVar3 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      if (uVar5 != 0) {
        uVar6 = (ulong)uVar3;
      }
    }
    uVar7 = uVar7 + 1;
  }
  pEVar1 = (this->entries).
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->entries).
                super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1;
  uVar6 = lVar4 % 0x18;
  for (uVar7 = 0; (ulong)uVar7 < (ulong)(lVar4 / 0x18); uVar7 = uVar7 + 1) {
    uVar8 = pEVar1[uVar7].ancestors.m_val;
    uVar5 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
      }
    }
    if (uVar8 == 0) {
      uVar5 = 0;
    }
    uVar6 = (ulong)uVar5;
    while (uVar8 != 0) {
      pEVar1[uVar6].descendants.m_val = pEVar1[uVar6].descendants.m_val | 1 << ((byte)uVar7 & 0x1f);
      uVar8 = uVar8 - 1 & uVar8;
      uVar5 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      if (uVar8 != 0) {
        uVar6 = (ulong)uVar5;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail(pEVar1,1,uVar6);
  }
  return;
}

Assistant:

DepGraph(const DepGraph<SetType>& depgraph, Span<const ClusterIndex> mapping) noexcept : entries(depgraph.TxCount())
    {
        Assert(mapping.size() == depgraph.TxCount());
        // Fill in fee, size, ancestors.
        for (ClusterIndex i = 0; i < depgraph.TxCount(); ++i) {
            const auto& input = depgraph.entries[i];
            auto& output = entries[mapping[i]];
            output.feerate = input.feerate;
            for (auto j : input.ancestors) output.ancestors.Set(mapping[j]);
        }
        // Fill in descendant information.
        for (ClusterIndex i = 0; i < entries.size(); ++i) {
            for (auto j : entries[i].ancestors) {
                entries[j].descendants.Set(i);
            }
        }
    }